

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::anon_unknown_0::PythonStubGenerator::GenerateEnumStub
          (PythonStubGenerator *this,stringstream *stub,EnumDef *enum_def,Imports *imports)

{
  Imports *pIVar1;
  bool bVar2;
  ostream *poVar3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *this_00;
  reference ppEVar4;
  BaseType type;
  string local_1b8;
  string local_198;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  string local_108;
  string local_e8;
  EnumVal *local_c8;
  EnumVal *val;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *__range3;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  string local_48;
  Imports *local_28;
  Imports *imports_local;
  EnumDef *enum_def_local;
  stringstream *stub_local;
  PythonStubGenerator *this_local;
  
  local_28 = imports;
  imports_local = (Imports *)enum_def;
  enum_def_local = (EnumDef *)stub;
  stub_local = (stringstream *)this;
  poVar3 = std::operator<<((ostream *)(stub + 0x10),"class ");
  IdlNamer::Type_abi_cxx11_(&local_48,&this->namer_,(EnumDef *)imports_local);
  std::operator<<(poVar3,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pIVar1 = local_28;
  if ((this->version_).major == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"enum",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"IntEnum",(allocator<char> *)((long)&__range3 + 7));
    Imports::Import(pIVar1,&local_78,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::operator<<((ostream *)(enum_def_local->super_Definition).name.field_2._M_local_buf,
                    "(IntEnum)");
  }
  else {
    std::operator<<((ostream *)(enum_def_local->super_Definition).name.field_2._M_local_buf,
                    "(object)");
  }
  std::operator<<((ostream *)(enum_def_local->super_Definition).name.field_2._M_local_buf,":\n");
  this_00 = EnumDef::Vals((EnumDef *)imports_local);
  __end3 = std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (this_00);
  val = (EnumVal *)
        std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                                *)&val);
    pIVar1 = local_28;
    if (!bVar2) break;
    ppEVar4 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&__end3);
    local_c8 = *ppEVar4;
    poVar3 = std::operator<<((ostream *)(enum_def_local->super_Definition).name.field_2._M_local_buf
                             ,"  ");
    IdlNamer::Variant_abi_cxx11_(&local_e8,&this->namer_,local_c8);
    poVar3 = std::operator<<(poVar3,(string *)&local_e8);
    poVar3 = std::operator<<(poVar3,": ");
    (anonymous_namespace)::PythonStubGenerator::ScalarType_abi_cxx11_
              (&local_108,
               (PythonStubGenerator *)
               (ulong)*(uint *)&imports_local[8].imports.
                                super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,type);
    poVar3 = std::operator<<(poVar3,(string *)&local_108);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&__end3);
  }
  if (((this->parser_->opts).generate_object_based_api & 1U &
      *(byte *)&imports_local[8].imports.
                super__Vector_base<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>
                ._M_impl.super__Vector_impl_data._M_finish & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"flatbuffers",&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"table",&local_151);
    Imports::Import(pIVar1,&local_128,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    poVar3 = std::operator<<((ostream *)(enum_def_local->super_Definition).name.field_2._M_local_buf
                             ,"def ");
    IdlNamer::Function_abi_cxx11_(&local_178,&this->namer_,(Definition *)imports_local);
    poVar3 = std::operator<<(poVar3,(string *)&local_178);
    poVar3 = std::operator<<(poVar3,"Creator(union_type: ");
    (anonymous_namespace)::PythonStubGenerator::EnumType_abi_cxx11_
              (&local_198,(PythonStubGenerator *)this,(EnumDef *)imports_local,local_28);
    poVar3 = std::operator<<(poVar3,(string *)&local_198);
    poVar3 = std::operator<<(poVar3,", table: table.Table) -> ");
    (anonymous_namespace)::PythonStubGenerator::UnionType_abi_cxx11_
              (&local_1b8,(PythonStubGenerator *)this,(EnumDef *)imports_local,local_28);
    poVar3 = std::operator<<(poVar3,(string *)&local_1b8);
    std::operator<<(poVar3,": ...\n");
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
  }
  return;
}

Assistant:

void GenerateEnumStub(std::stringstream &stub, const EnumDef *enum_def,
                        Imports *imports) const {
    stub << "class " << namer_.Type(*enum_def);

    if (version_.major == 3){
      imports->Import("enum", "IntEnum");
      stub << "(IntEnum)";
    }
    else {
      stub << "(object)";
    }

    stub << ":\n";
    for (const EnumVal *val : enum_def->Vals()) {
      stub << "  " << namer_.Variant(*val) << ": "
           << ScalarType(enum_def->underlying_type.base_type) << "\n";
    }

    if (parser_.opts.generate_object_based_api & enum_def->is_union) {
      imports->Import("flatbuffers", "table");
      stub << "def " << namer_.Function(*enum_def)
           << "Creator(union_type: " << EnumType(*enum_def, imports)
           << ", table: table.Table) -> " << UnionType(*enum_def, imports)
           << ": ...\n";
    }
  }